

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# popt.c
# Opt level: O1

int poptSaveLong(long *arg,uint argInfo,long aLong)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  
  iVar1 = -0x14;
  if (((ulong)arg & 7) == 0 && arg != (long *)0x0) {
    if (aLong == 0) {
      aLong = 0;
    }
    else if (((argInfo >> 0x16 & 1) != 0) && (aLong = poptRandomValue(aLong), aLong < 0)) {
      return (int)aLong;
    }
    uVar2 = argInfo >> 0x19 & 7;
    iVar1 = -0x13;
    if (uVar2 < 5) {
      uVar3 = aLong ^ (int)(argInfo << 7) >> 0x1f;
      switch(uVar2) {
      case 0:
        *arg = uVar3;
        break;
      case 1:
        *arg = *arg ^ uVar3;
        break;
      case 2:
        *arg = *arg & uVar3;
        break;
      case 3:
        goto switchD_001033b1_caseD_3;
      case 4:
        *arg = *arg | uVar3;
      }
      iVar1 = 0;
    }
  }
switchD_001033b1_caseD_3:
  return iVar1;
}

Assistant:

int poptSaveLong(long * arg, unsigned int argInfo, long aLong)
{
    /* XXX Check alignment, may fail on funky platforms. */
    if (arg == NULL || (((unsigned long)arg) & (ALIGNOF(*arg)-1)))
	return POPT_ERROR_NULLARG;

    if (aLong != 0 && LF_ISSET(RANDOM)) {
	aLong = (long)poptRandomValue(aLong);
	if (aLong < 0)
	    return aLong;
    }
    if (LF_ISSET(NOT))
	aLong = ~aLong;
    switch (LF_ISSET(LOGICALOPS)) {
    case 0:		   *arg = aLong; break;
    case POPT_ARGFLAG_OR:  *(unsigned long *)arg |= (unsigned long)aLong; break;
    case POPT_ARGFLAG_AND: *(unsigned long *)arg &= (unsigned long)aLong; break;
    case POPT_ARGFLAG_XOR: *(unsigned long *)arg ^= (unsigned long)aLong; break;
    default:
	return POPT_ERROR_BADOPERATION;
	break;
    }
    return 0;
}